

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

cram_codec *
cram_byte_array_len_decode_init(char *data,int size,cram_external_type option,int version)

{
  byte bVar1;
  long lVar2;
  cram_codec *pcVar3;
  long lVar4;
  cram_codec *pcVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  cram_encoding cVar10;
  char *data_00;
  
  pcVar3 = (cram_codec *)malloc(0x240);
  if (pcVar3 != (cram_codec *)0x0) {
    pcVar3->codec = E_BYTE_ARRAY_LEN;
    pcVar3->decode = cram_byte_array_len_decode;
    pcVar3->free = cram_byte_array_len_decode_free;
    bVar1 = *data;
    cVar10 = (cram_encoding)bVar1;
    lVar4 = 1;
    if ((char)bVar1 < '\0') {
      uVar9 = (uint)bVar1;
      cVar10 = (cram_encoding)(byte)data[1];
      if (bVar1 < 0xc0) {
        cVar10 = (uVar9 & 0x3f) << 8 | cVar10;
        lVar6 = 2;
      }
      else if (bVar1 < 0xe0) {
        cVar10 = (uVar9 & 0x1f) << 0x10 | cVar10 << 8 | (uint)(byte)data[2];
        lVar6 = 3;
      }
      else if (bVar1 < 0xf0) {
        cVar10 = (uVar9 & 0xf) << 0x18 | cVar10 << 0x10 | (uint)(byte)data[2] << 8 |
                 (uint)(byte)data[3];
        lVar6 = 4;
      }
      else {
        cVar10 = (byte)data[4] & (E_GOLOMB_RICE|E_SUBEXP) |
                 (uint)(byte)data[3] << 4 |
                 (uint)(byte)data[2] << 0xc | cVar10 << 0x14 | uVar9 << 0x1c;
        lVar6 = 5;
      }
    }
    else {
      lVar6 = 1;
    }
    bVar1 = data[lVar6];
    uVar9 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      uVar8 = (uint)bVar1;
      uVar9 = (uint)(byte)data[lVar6 + 1];
      if (bVar1 < 0xc0) {
        uVar9 = (uVar8 & 0x3f) << 8 | uVar9;
        lVar4 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar9 = (uVar8 & 0x1f) << 0x10 | uVar9 << 8 | (uint)(byte)data[lVar6 + 2];
        lVar4 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar9 = (uVar8 & 0xf) << 0x18 | uVar9 << 0x10 | (uint)(byte)data[lVar6 + 2] << 8 |
                (uint)(byte)data[lVar6 + 3];
        lVar4 = 4;
      }
      else {
        uVar9 = (byte)data[lVar6 + 4] & 0xf |
                (uint)(byte)data[lVar6 + 3] << 4 |
                (uint)(byte)data[lVar6 + 2] << 0xc | uVar9 << 0x14 | uVar8 << 0x1c;
        lVar4 = 5;
      }
    }
    data_00 = data + lVar4 + lVar6;
    pcVar5 = cram_decoder_init(cVar10,data_00,uVar9,E_INT,version);
    (pcVar3->field_6).byte_array_len.len_codec = pcVar5;
    lVar4 = (long)(int)uVar9;
    bVar1 = data_00[lVar4];
    cVar10 = (cram_encoding)bVar1;
    lVar6 = 1;
    if ((char)bVar1 < '\0') {
      uVar9 = (uint)bVar1;
      cVar10 = (cram_encoding)(byte)data_00[lVar4 + 1];
      if (bVar1 < 0xc0) {
        cVar10 = (uVar9 & 0x3f) << 8 | cVar10;
        lVar7 = 2;
      }
      else if (bVar1 < 0xe0) {
        cVar10 = (uVar9 & 0x1f) << 0x10 | cVar10 << 8 | (uint)(byte)data_00[lVar4 + 2];
        lVar7 = 3;
      }
      else if (bVar1 < 0xf0) {
        cVar10 = (uVar9 & 0xf) << 0x18 | cVar10 << 0x10 | (uint)(byte)data_00[lVar4 + 2] << 8 |
                 (uint)(byte)data_00[lVar4 + 3];
        lVar7 = 4;
      }
      else {
        cVar10 = (byte)data_00[lVar4 + 4] & (E_GOLOMB_RICE|E_SUBEXP) |
                 (uint)(byte)data_00[lVar4 + 3] << 4 |
                 (uint)(byte)data_00[lVar4 + 2] << 0xc | cVar10 << 0x14 | uVar9 << 0x1c;
        lVar7 = 5;
      }
    }
    else {
      lVar7 = 1;
    }
    lVar2 = lVar7 + lVar4;
    bVar1 = data_00[lVar7 + lVar4];
    uVar9 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      uVar8 = (uint)bVar1;
      uVar9 = (uint)(byte)data_00[lVar2 + 1];
      if (bVar1 < 0xc0) {
        uVar9 = (uVar8 & 0x3f) << 8 | uVar9;
        lVar6 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar9 = (uVar8 & 0x1f) << 0x10 | uVar9 << 8 | (uint)(byte)data_00[lVar2 + 2];
        lVar6 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar9 = (uVar8 & 0xf) << 0x18 | uVar9 << 0x10 | (uint)(byte)data_00[lVar2 + 2] << 8 |
                (uint)(byte)data_00[lVar2 + 3];
        lVar6 = 4;
      }
      else {
        uVar9 = (byte)data_00[lVar2 + 4] & 0xf |
                (uint)(byte)data_00[lVar2 + 3] << 4 |
                (uint)(byte)data_00[lVar2 + 2] << 0xc | uVar9 << 0x14 | uVar8 << 0x1c;
        lVar6 = 5;
      }
    }
    pcVar5 = cram_decoder_init(cVar10,data_00 + lVar6 + lVar2,uVar9,option,version);
    (pcVar3->field_6).byte_array_len.value_codec = pcVar5;
    if (data_00 + lVar6 + lVar2 + ((long)(int)uVar9 - (long)data) == (char *)(long)size) {
      return pcVar3;
    }
    cram_byte_array_len_decode_init_cold_1();
  }
  return (cram_codec *)0x0;
}

Assistant:

cram_codec *cram_byte_array_len_decode_init(char *data, int size,
					    enum cram_external_type option,
					    int version) {
    cram_codec *c;
    char *cp = data;
    int32_t encoding;
    int32_t sub_size;

    if (!(c = malloc(sizeof(*c))))
	return NULL;

    c->codec  = E_BYTE_ARRAY_LEN;
    c->decode = cram_byte_array_len_decode;
    c->free   = cram_byte_array_len_decode_free;
    
    cp += itf8_get(cp, &encoding);
    cp += itf8_get(cp, &sub_size);
    c->byte_array_len.len_codec = cram_decoder_init(encoding, cp, sub_size,
						    E_INT, version);
    cp += sub_size;

    cp += itf8_get(cp, &encoding);
    cp += itf8_get(cp, &sub_size);
    c->byte_array_len.value_codec = cram_decoder_init(encoding, cp, sub_size,
						      option, version);
    cp += sub_size;

    if (cp - data != size) {
	fprintf(stderr, "Malformed byte_array_len header stream\n");
	free(c);
	return NULL;
    }

    return c;
}